

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O2

int PDFObjectParserTest(int argc,char **argv)

{
  IReadPositionProvider *inCurrentPositionProvider;
  string *psVar1;
  bool bVar2;
  uint uVar3;
  EStatusCode EVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  PDFObjectParser *this;
  PDFObject *pPVar11;
  ostream *poVar12;
  uint uVar13;
  ExpectedResult<PDFLiteralString> result;
  string local_790;
  int local_76c;
  int local_768;
  int local_764;
  uint local_760;
  allocator<char> local_75a;
  allocator<char> local_759;
  InputInterfaceToStream input;
  string local_718;
  RefCountPtr<PDFObject> object;
  PDFObjectParserTestLogHelper log;
  string local_6a0;
  PDFParser parser;
  
  OutputFile::OutputFile(&log.mOutput);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a0,"PDFObjectParserTest.txt",&local_75a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&object,argv[2],&local_759);
  PosixPath::PosixPath((PosixPath *)&parser,(string *)&object);
  PosixPath::ToFileURL((FileURL *)&local_790,(PosixPath *)&parser);
  PosixPath::~PosixPath((PosixPath *)&parser);
  FileURL::FileURL((FileURL *)&result,&local_6a0);
  FileURL::InterpretFrom((FileURL *)&input,(FileURL *)&result,(FileURL *)&local_790);
  PosixPath::PosixPath((PosixPath *)&parser);
  PosixPath::FromFileURL((PosixPath *)&parser,(FileURL *)&input);
  PosixPath::ToString_abi_cxx11_(&local_718,(PosixPath *)&parser);
  PosixPath::~PosixPath((PosixPath *)&parser);
  FileURL::~FileURL((FileURL *)&input);
  FileURL::~FileURL((FileURL *)&result);
  FileURL::~FileURL((FileURL *)&local_790);
  std::__cxx11::string::~string((string *)&object);
  EVar4 = PDFObjectParserTestLogHelper::openLog(&log,&local_718);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_6a0);
  if (EVar4 != eSuccess) {
    std::operator<<((ostream *)&std::cout,"failed to initialize log output\n");
    iVar5 = -1;
    goto LAB_0013d2ee;
  }
  PDFParser::PDFParser(&parser);
  this = PDFParser::GetObjectParser(&parser);
  InputInterfaceToStream::InputInterfaceToStream(&input);
  object._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
  object.mValue = (PDFObject *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"(val%ami)",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"val%ami",(allocator<char> *)&local_718);
  iVar5 = ExpectedResult<PDFLiteralString>::setResult(&result,&input.mInput,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  if (0 < iVar5) {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "Failed tests in PDFObjectParserTest::ParseCommentedTokens: ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  RefCountPtr<PDFObject>::~RefCountPtr(&object);
  InputInterfaceToStream::~InputInterfaceToStream(&input);
  InputInterfaceToStream::InputInterfaceToStream(&input);
  object._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
  object.mValue = (PDFObject *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"<>",(allocator<char> *)&local_790);
  local_760 = CONCAT31(local_760._1_3_,0 < iVar5);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  local_764 = iVar5;
  std::__cxx11::string::~string((string *)&result);
  inCurrentPositionProvider = &input.super_IReadPositionProvider;
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"",(allocator<char> *)&local_718);
  psVar1 = &input.mInput;
  local_768 = ExpectedResult<PDFHexString>::setResult
                        ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"<   >",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"",(allocator<char> *)&local_718);
  iVar5 = ExpectedResult<PDFHexString>::setResult
                    ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"<\n>",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"",(allocator<char> *)&local_718);
  local_76c = ExpectedResult<PDFHexString>::setResult
                        ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"< 41   4 2 >",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"AB",(allocator<char> *)&local_718);
  iVar6 = ExpectedResult<PDFHexString>::setResult
                    ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"<04000201>",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  local_790.field_2._M_allocated_capacity._0_4_ = 0x1020004;
  local_790._M_string_length = 4;
  local_790.field_2._M_local_buf[4] = '\0';
  iVar7 = ExpectedResult<PDFHexString>::setResult
                    ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"<feff00410042>",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"AB",(allocator<char> *)&local_718);
  iVar8 = ExpectedResult<PDFHexString>::setResult
                    ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"<f e f f 0 04 10042>",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"AB",(allocator<char> *)&local_718);
  iVar9 = ExpectedResult<PDFHexString>::setResult
                    ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"<5>",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream(this,&input.super_IByteReader,inCurrentPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFHexString>::ExpectedResult((ExpectedResult<PDFHexString> *)&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"P",(allocator<char> *)&local_718);
  iVar10 = ExpectedResult<PDFHexString>::setResult
                     ((ExpectedResult<PDFHexString> *)&result,psVar1,&local_790,&log);
  iVar9 = iVar5 + local_768 + local_76c + iVar6 + iVar7 + iVar8 + iVar9;
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFHexString>::~ExpectedResult((ExpectedResult<PDFHexString> *)&result);
  iVar5 = iVar9 + iVar10;
  if (iVar5 != 0 && SCARRY4(iVar9,iVar10) == iVar5 < 0) {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "Failed tests in PDFObjectParserTest::ParseHexStringTokens: ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  uVar3 = local_760 & 0xff;
  bVar2 = 0 < local_764;
  RefCountPtr<PDFObject>::~RefCountPtr(&object);
  InputInterfaceToStream::~InputInterfaceToStream(&input);
  uVar13 = bVar2 + 1;
  if (iVar5 < 1) {
    uVar13 = uVar3;
  }
  InputInterfaceToStream::InputInterfaceToStream(&input);
  object._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
  object.mValue = (PDFObject *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"()",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"",(allocator<char> *)&local_718);
  psVar1 = &input.mInput;
  local_760 = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"( )",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790," ",(allocator<char> *)&local_718);
  iVar5 = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"( \n )",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790," \n ",(allocator<char> *)&local_718);
  local_764 = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"( \\\n )",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"  ",(allocator<char> *)&local_718);
  local_768 = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"( ( ) )",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790," ( ) ",(allocator<char> *)&local_718);
  local_76c = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"( \\( \\) )",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790," ( ) ",(allocator<char> *)&local_718);
  iVar6 = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"(\\101\\102)",(allocator<char> *)&local_790);
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"AB",(allocator<char> *)&local_718);
  iVar7 = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  result.mObject._vptr_RefCountPtr = (_func_int **)&result.mTypedObject;
  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"(\\376\\377\\0\\101)","");
  InputInterfaceToStream::setInput(&input,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  PDFObjectParser::SetReadStream
            (this,&input.super_IByteReader,&input.super_IReadPositionProvider,false);
  pPVar11 = PDFObjectParser::ParseNewObject(this);
  ExpectedResult<PDFLiteralString>::ExpectedResult(&result,pPVar11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"A",(allocator<char> *)&local_718);
  iVar8 = ExpectedResult<PDFLiteralString>::setResult(&result,psVar1,&local_790,&log);
  iVar7 = iVar5 + local_760 + local_764 + local_768 + local_76c + iVar6 + iVar7;
  std::__cxx11::string::~string((string *)&local_790);
  ExpectedResult<PDFLiteralString>::~ExpectedResult(&result);
  iVar5 = iVar7 + iVar8;
  if (iVar5 != 0 && SCARRY4(iVar7,iVar8) == iVar5 < 0) {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "Failed tests in PDFObjectParserTest::ParseLiteralStringTokens: ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  RefCountPtr<PDFObject>::~RefCountPtr(&object);
  InputInterfaceToStream::~InputInterfaceToStream(&input);
  if (iVar5 < 1) {
    if (uVar13 != 0) goto LAB_0013d2b9;
    iVar5 = 0;
  }
  else {
    uVar13 = uVar13 + 1;
LAB_0013d2b9:
    poVar12 = std::operator<<((ostream *)&std::cout,"Failed tests in PDFObjectParserTest: ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar13);
    std::endl<char,std::char_traits<char>>(poVar12);
    iVar5 = 1;
  }
  PDFParser::~PDFParser(&parser);
LAB_0013d2ee:
  OutputFile::~OutputFile(&log.mOutput);
  return iVar5;
}

Assistant:

int PDFObjectParserTest(int argc, char* argv[])
{
	int failures = 0;
	PDFObjectParserTestLogHelper log;
	if (log.openLog(BuildRelativeOutputPath(argv, "PDFObjectParserTest.txt")) != eSuccess){
		cout << "failed to initialize log output\n";
		return eFailure;
	}


	PDFParser parser;
	PDFObjectParser*  pObjectParser = &parser.GetObjectParser();

	if (ParseCommentedTokens(pObjectParser,&log) == eFailure){
		++failures;
	}

	if (ParseHexStringTokens(pObjectParser,&log) == eFailure){
		++failures;
	}

	if (ParseLiteralStringTokens(pObjectParser,&log) == eFailure){
		++failures;
	}



	if (failures > 0){
		cout << "Failed tests in PDFObjectParserTest: " << failures << endl;
		return 1;
	}
	return 0;
}